

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O1

void __thiscall SM83::add_hl_hl(SM83 *this)

{
  ushort uVar1;
  string_view fmt;
  format_args args;
  ulong local_68 [2];
  ulong local_58;
  ulong local_48;
  ulong local_38;
  ulong local_28;
  ulong local_18;
  
  local_68[0] = (ulong)(this->field_0).af;
  local_58 = (ulong)(this->field_1).bc;
  local_48 = (ulong)(this->field_2).de;
  local_38 = (ulong)(this->field_3).hl;
  local_28 = (ulong)this->sp;
  local_18 = (ulong)this->pc_at_opcode;
  fmt.size_ = 0x48;
  fmt.data_ = "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  ADD HL, HL\n";
  args.field_1.values_ = (value<fmt::v11::context> *)local_68;
  args.desc_ = 0x222222;
  ::fmt::v11::vprint(fmt,args);
  uVar1 = (this->field_3).hl;
  (this->field_0).field_1.f =
       (byte)(uVar1 >> 0xb) & 0x10 | (byte)(uVar1 >> 6) & 0x20 | (this->field_0).field_1.f & 0x8f;
  (this->field_3).hl = uVar1 * 2;
  Timer::AdvanceCycles(this->timer,4);
  return;
}

Assistant:

void SM83::add_hl_hl() {
    LTRACE("ADD HL, HL");
    u32 result = hl + hl;

    SetNegateFlag(false);
    SetHalfCarryFlag(((hl & 0xFFF) + (hl & 0xFFF)) & 0x1000);
    SetCarryFlag((result & 0x10000) != 0);

    hl = static_cast<u16>(result);

    timer.AdvanceCycles(4);
}